

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

uint32_t __thiscall GGWave::encodeSize_samples(GGWave *this)

{
  int iVar1;
  long in_RDI;
  int totalDataFrames;
  int totalBytes;
  int sendDataLength;
  int nECCBytesPerTx;
  int samplesPerFrameOut;
  float factor;
  float *in_stack_00000040;
  int in_stack_00000048;
  float in_stack_0000004c;
  Resampler *in_stack_00000050;
  undefined4 local_18;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x328) & 1) == 0) {
    local_4 = 0;
  }
  else {
    local_18 = *(int *)(in_RDI + 0xc);
    if ((*(byte *)(in_RDI + 0x4e) & 1) != 0) {
      ggvector<float>::data((ggvector<float> *)(in_RDI + 0x4f8));
      local_18 = Resampler::resample(in_stack_00000050,in_stack_0000004c,in_stack_00000048,
                                     in_stack_00000040,&this->m_sampleRateInp);
      local_18 = local_18 + 1;
    }
    iVar1 = anon_unknown.dwarf_1d8e::getECCBytesForLength(*(int *)(in_RDI + 0x330));
    local_4 = (*(int *)(in_RDI + 0x38) +
               (int)*(char *)(in_RDI + 0x394) *
               ((*(int *)(in_RDI + 0x330) + *(int *)(in_RDI + 0x3c) + iVar1 +
                 (int)*(char *)(in_RDI + 0x393) + -1) / (int)*(char *)(in_RDI + 0x393)) *
               (int)*(char *)(in_RDI + 0x392) + *(int *)(in_RDI + 0x38)) * local_18;
  }
  return local_4;
}

Assistant:

uint32_t GGWave::encodeSize_samples() const {
    if (m_tx.hasData == false) {
        return 0;
    }

    float factor = 1.0f;
    int samplesPerFrameOut = m_samplesPerFrame;
    if (m_needResampling) {
        factor = m_sampleRate/m_sampleRateOut;
        // note : +1 extra sample in order to overestimate the buffer size
        samplesPerFrameOut = m_resampler.resample(factor, m_samplesPerFrame, m_tx.output.data(), nullptr) + 1;
    }
    const int nECCBytesPerTx = getECCBytesForLength(m_tx.dataLength);
    const int sendDataLength = m_tx.dataLength + m_encodedDataOffset;
    const int totalBytes = sendDataLength + nECCBytesPerTx;
    const int totalDataFrames = m_tx.protocol.extra*((totalBytes + m_tx.protocol.bytesPerTx - 1)/m_tx.protocol.bytesPerTx)*m_tx.protocol.framesPerTx;

    return (
            m_nMarkerFrames + totalDataFrames + m_nMarkerFrames
           )*samplesPerFrameOut;
}